

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O1

size_type __thiscall
packing::AssignedProtos::combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
          (AssignedProtos *this,_Node_iterator<unsigned_short,_true,_false> *begin,
          _Node_iterator<unsigned_short,_true,_false> *end)

{
  __node_type *p_Var1;
  __node_type *p_Var2;
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var3;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  
  p_Var3 = (_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)uniqueColors(this);
  p_Var2 = (end->super__Node_iterator_base<unsigned_short,_false>)._M_cur;
  local_28 = p_Var3;
  for (p_Var1 = (begin->super__Node_iterator_base<unsigned_short,_false>)._M_cur; p_Var1 != p_Var2;
      p_Var1 = (__node_type *)(p_Var1->super__Hash_node_base)._M_nxt) {
    std::
    _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
              (p_Var3,&p_Var1->super__Hash_node_value<unsigned_short,_false>,&local_28);
  }
  return *(size_type *)(p_Var3 + 0x18);
}

Assistant:

auto combinedVolume(Iter &&begin, Iter &&end) const {
		auto &colors = uniqueColors();
		colors.insert(std::forward<Iter>(begin), std::forward<Iter>(end));
		return colors.size();
	}